

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O1

void __thiscall
t_netstd_generator::generate_netstd_property
          (t_netstd_generator *this,ostream *out,t_field *tfield,bool isPublic,bool generateIsset,
          string *fieldPrefix)

{
  int *piVar1;
  pointer pcVar2;
  ostream *poVar3;
  char *pcVar4;
  t_netstd_generator *this_00;
  string local_b8;
  string local_98;
  string local_78;
  string *local_58;
  string local_50;
  
  local_58 = fieldPrefix;
  if (this->serialize_ == false) {
    if ((this->wcf_ & isPublic) == 0) goto LAB_002d57d4;
  }
  else if (!isPublic) goto LAB_002d57d4;
  t_generator::indent_abi_cxx11_(&local_b8,(t_generator *)this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_b8._M_dataplus._M_p,local_b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"[DataMember(Order = 0)]",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
LAB_002d57d4:
  t_generator::indent_abi_cxx11_(&local_b8,(t_generator *)this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_b8._M_dataplus._M_p,local_b8._M_string_length);
  pcVar4 = "private ";
  if (isPublic) {
    pcVar4 = "public ";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar4,8 - (ulong)isPublic);
  type_name_abi_cxx11_(&local_98,this,tfield->type_,true);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_98._M_dataplus._M_p,local_98._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  prop_name_abi_cxx11_(&local_78,this,tfield,false);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,local_78._M_dataplus._M_p,local_78._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if (tfield->req_ == T_REQUIRED) {
    std::__ostream_insert<char,std::char_traits<char>>(out," { get; set; }",0xe);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  else {
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    t_generator::indent_abi_cxx11_(&local_b8,(t_generator *)this);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_b8._M_dataplus._M_p,local_b8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"{",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    t_generator::indent_abi_cxx11_(&local_b8,(t_generator *)this);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_b8._M_dataplus._M_p,local_b8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"get",3);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_98,(t_generator *)this);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_98._M_dataplus._M_p,local_98._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"{",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    t_generator::indent_abi_cxx11_(&local_b8,(t_generator *)this);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_b8._M_dataplus._M_p,local_b8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"return ",7);
    std::operator+(&local_98,local_58,&tfield->name_);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_98._M_dataplus._M_p,local_98._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,";",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    t_generator::indent_abi_cxx11_(&local_b8,(t_generator *)this);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_b8._M_dataplus._M_p,local_b8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"}",1);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_98,(t_generator *)this);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_98._M_dataplus._M_p,local_98._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"set",3);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_78,(t_generator *)this);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_78._M_dataplus._M_p,local_78._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"{",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    if (generateIsset) {
      t_generator::indent_abi_cxx11_(&local_b8,(t_generator *)this);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_b8._M_dataplus._M_p,local_b8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"__isset.",8);
      pcVar2 = (tfield->name_)._M_dataplus._M_p;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar2,pcVar2 + (tfield->name_)._M_string_length);
      this_00 = this;
      normalize_name(&local_78,this,&local_50,false);
      get_isset_name(&local_98,this_00,&local_78);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_98._M_dataplus._M_p,local_98._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," = true;",8);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
    }
    t_generator::indent_abi_cxx11_(&local_b8,(t_generator *)this);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_b8._M_dataplus._M_p,local_b8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"this.",5);
    std::operator+(&local_98,local_58,&tfield->name_);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_98._M_dataplus._M_p,local_98._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," = value;",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    t_generator::indent_abi_cxx11_(&local_b8,(t_generator *)this);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_b8._M_dataplus._M_p,local_b8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"}",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    t_generator::indent_abi_cxx11_(&local_b8,(t_generator *)this);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_b8._M_dataplus._M_p,local_b8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"}",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  return;
}

Assistant:

void t_netstd_generator::generate_netstd_property(ostream& out, t_field* tfield, bool isPublic, bool generateIsset, string fieldPrefix)
{
    if ((is_serialize_enabled() || is_wcf_enabled()) && isPublic)
    {
        out << indent() << "[DataMember(Order = 0)]" << endl;
    }
    out << indent() << (isPublic ? "public " : "private ") << type_name(tfield->get_type()) << " " << prop_name(tfield);

    bool is_required = field_is_required(tfield);
    if (is_required)
    {
        out << " { get; set; }" << endl;
    }
    else
    {
        out << endl
            << indent() << "{" << endl;
        indent_up();

        out << indent() << "get" << endl
            << indent() << "{" << endl;
        indent_up();

        out << indent() << "return " << fieldPrefix + tfield->get_name() << ";" << endl;
        indent_down();
        out << indent() << "}" << endl
            << indent() << "set" << endl
            << indent() << "{" << endl;
        indent_up();

        if (generateIsset)
        {
            out << indent() << "__isset." << get_isset_name(normalize_name(tfield->get_name())) << " = true;" << endl;
        }
        out << indent() << "this." << fieldPrefix + tfield->get_name() << " = value;" << endl;

        indent_down();
        out << indent() << "}" << endl;
        indent_down();
        out << indent() << "}" << endl;
    }
    out << endl;
}